

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::
     types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>
               (Proxy_Function_Base **t_func,Function_Params *plist,
               Type_Conversions_State *t_conversions)

{
  int iVar1;
  size_t sVar2;
  size_type sVar3;
  Boxed_Value *__first1;
  Boxed_Value *__last1;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_78;
  Boxed_Value *local_70;
  pair<const_chaiscript::Boxed_Value_*,___gnu_cxx::__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>_>
  local_68;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *local_58;
  __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
  local_50;
  Type_Info *local_48;
  pair<const_chaiscript::Boxed_Value_*,___gnu_cxx::__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>_>
  local_40;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *local_30;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *types;
  Type_Conversions_State *t_conversions_local;
  Function_Params *plist_local;
  Proxy_Function_Base **t_func_local;
  
  types = (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)t_conversions;
  t_conversions_local = (Type_Conversions_State *)plist;
  plist_local = (Function_Params *)t_func;
  local_30 = Proxy_Function_Base::get_param_types(*t_func);
  iVar1 = Proxy_Function_Base::get_arity((Proxy_Function_Base *)plist_local->m_begin);
  if (iVar1 == -1) {
    t_func_local._7_1_ = false;
  }
  else {
    sVar2 = Function_Params::size((Function_Params *)t_conversions_local);
    sVar3 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                      (local_30);
    if (sVar2 != sVar3 - 1) {
      __assert_fail("plist.size() == types.size() - 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/dispatchkit/proxy_functions.hpp"
                    ,0x2bd,
                    "bool chaiscript::dispatch::detail::types_match_except_for_arithmetic(const FuncType &, const chaiscript::Function_Params &, const Type_Conversions_State &) [FuncType = const chaiscript::dispatch::Proxy_Function_Base *]"
                   );
    }
    __first1 = Function_Params::begin((Function_Params *)t_conversions_local);
    __last1 = Function_Params::end((Function_Params *)t_conversions_local);
    local_50._M_current =
         (Type_Info *)
         std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::begin(local_30)
    ;
    local_48 = (Type_Info *)
               __gnu_cxx::
               __normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
               ::operator+(&local_50,1);
    local_58 = types;
    local_40 = std::
               mismatch<chaiscript::Boxed_Value_const*,__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>,chaiscript::dispatch::detail::types_match_except_for_arithmetic<chaiscript::dispatch::Proxy_Function_Base_const*>(chaiscript::dispatch::Proxy_Function_Base_const*const&,chaiscript::Function_Params_const&,chaiscript::Type_Conversions_State_const&)::_lambda(chaiscript::Boxed_Value_const&,chaiscript::Type_Info_const&)_1_>
                         (__first1,__last1,
                          (__normal_iterator<const_chaiscript::Type_Info_*,_std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>_>
                           )local_48,(anon_class_8_1_9eaa0cf2_for__M_comp)types);
    local_70 = Function_Params::end((Function_Params *)t_conversions_local);
    local_78._M_current =
         (Type_Info *)
         std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::end(local_30);
    local_68 = std::
               make_pair<chaiscript::Boxed_Value_const*,__gnu_cxx::__normal_iterator<chaiscript::Type_Info_const*,std::vector<chaiscript::Type_Info,std::allocator<chaiscript::Type_Info>>>>
                         (&local_70,&local_78);
    t_func_local._7_1_ = std::operator==(&local_40,&local_68);
  }
  return t_func_local._7_1_;
}

Assistant:

bool types_match_except_for_arithmetic(const FuncType &t_func,
                                             const chaiscript::Function_Params &plist,
                                             const Type_Conversions_State &t_conversions) noexcept {
        const std::vector<Type_Info> &types = t_func->get_param_types();

        if (t_func->get_arity() == -1) {
          return false;
        }

        assert(plist.size() == types.size() - 1);

        return std::mismatch(plist.begin(),
                             plist.end(),
                             types.begin() + 1,
                             [&](const Boxed_Value &bv, const Type_Info &ti) {
                               return Proxy_Function_Base::compare_type_to_param(ti, bv, t_conversions)
                                   || (bv.get_type_info().is_arithmetic() && ti.is_arithmetic());
                             })
            == std::make_pair(plist.end(), types.end());
      }